

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcess.cpp
# Opt level: O2

string * __thiscall
MultiAgentDecisionProcess::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,MultiAgentDecisionProcess *this)

{
  ostream *poVar1;
  stringstream ss;
  string asStack_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,"Problem:");
  std::__cxx11::string::string(asStack_1c8,(string *)&(this->_m_name)._m_name);
  poVar1 = std::operator<<(poVar1,asStack_1c8);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(asStack_1c8);
  poVar1 = std::operator<<(local_198,"descr.:");
  std::__cxx11::string::string(asStack_1c8,(string *)&(this->_m_name)._m_description);
  poVar1 = std::operator<<(poVar1,asStack_1c8);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(asStack_1c8);
  poVar1 = std::operator<<(local_198,"nrAgents=");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_198,"problem file=");
  poVar1 = std::operator<<(poVar1,(string *)&this->_m_problemFile);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_198,"unixName=");
  poVar1 = std::operator<<(poVar1,(string *)&this->_m_unixName);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string MultiAgentDecisionProcess::SoftPrint() const
{
    stringstream ss;
    ss << "Problem:"<< _m_name.GetName()<< endl;
    ss << "descr.:"<< _m_name.GetDescription() << endl;
    ss << "nrAgents=" << _m_nrAgents << endl;
    ss << "problem file=" << _m_problemFile << endl;
    ss << "unixName=" << _m_unixName << endl;
    return(ss.str());
}